

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O3

void CreateMsgWindow(float fTimeToDisplay,int numSee,int numShow,int bufTime)

{
  int iVar1;
  _Node *p_Var2;
  unique_lock<std::recursive_mutex> lock;
  char aszMsgTxt [500];
  logLevelTy local_250;
  float local_24c;
  unique_lock<std::recursive_mutex> local_248;
  float local_238;
  long *local_228 [2];
  long local_218 [62];
  
  local_248._M_device = &gListMutex;
  local_248._M_owns = false;
  local_238 = fTimeToDisplay;
  std::unique_lock<std::recursive_mutex>::lock(&local_248);
  local_248._M_owns = true;
  if (listTexts_abi_cxx11_.super__List_base<dispTextTy,_std::allocator<dispTextTy>_>._M_impl._M_node
      .super__List_node_base._M_next != (_List_node_base *)&listTexts_abi_cxx11_) {
    std::__cxx11::string::substr
              ((ulong)local_228,
               (ulong)&listTexts_abi_cxx11_.
                       super__List_base<dispTextTy,_std::allocator<dispTextTy>_>._M_impl._M_node.
                       super__List_node_base._M_next[1]._M_prev);
    iVar1 = std::__cxx11::string::compare((char *)local_228);
    if (local_228[0] != local_218) {
      operator_delete(local_228[0],local_218[0] + 1);
    }
    if (iVar1 == 0) {
      std::__cxx11::list<dispTextTy,_std::allocator<dispTextTy>_>::_M_erase
                (&listTexts_abi_cxx11_,
                 (iterator)
                 listTexts_abi_cxx11_.super__List_base<dispTextTy,_std::allocator<dispTextTy>_>.
                 _M_impl._M_node.super__List_node_base._M_next);
    }
  }
  if (-1 < bufTime) {
    snprintf((char *)local_228,500,
             "Filling buffer: seeing %d aircraft, displaying %d, still %ds to buffer",
             (ulong)(uint)numSee,numShow,(ulong)(uint)bufTime);
    local_24c = -local_238;
    local_250 = logINFO;
    p_Var2 = std::__cxx11::list<dispTextTy,std::allocator<dispTextTy>>::
             _M_create_node<float,logLevelTy,char(&)[500]>
                       ((list<dispTextTy,std::allocator<dispTextTy>> *)&listTexts_abi_cxx11_,
                        &local_24c,&local_250,(char (*) [500])local_228);
    std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
    listTexts_abi_cxx11_.super__List_base<dispTextTy,_std::allocator<dispTextTy>_>._M_impl._M_node.
    _M_size = listTexts_abi_cxx11_.super__List_base<dispTextTy,_std::allocator<dispTextTy>_>._M_impl
              ._M_node._M_size + 1;
  }
  WndMsg::DoShow();
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_248);
  return;
}

Assistant:

void CreateMsgWindow(float fTimeToDisplay, int numSee, int numShow, int bufTime)
{
    // This entry shall always be the first one in the list
    // So let's see if it is already the first one, then we'd remove it first
    std::unique_lock<std::recursive_mutex> lock(gListMutex);
    if (!listTexts.empty() && listTexts.front().text.substr(0,23) == MSG_BUF_FILL_BEGIN)
        listTexts.pop_front();
    
    // Now create the actual message if there is anything to show
    if (bufTime >= 0) {
        char aszMsgTxt[500];
        snprintf(aszMsgTxt, sizeof(aszMsgTxt), MSG_BUF_FILL_COUNTDOWN,
                 numSee, numShow, bufTime);
        // add to list of display texts _at front_
        listTexts.emplace_front(-fTimeToDisplay, logINFO, aszMsgTxt);
    }
    
    // Show the window
    WndMsg::DoShow();
}